

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

double __thiscall smf::Options::getDouble(Options *this,string *optionName)

{
  char *__nptr;
  double dVar1;
  string local_38;
  string *local_18;
  string *optionName_local;
  Options *this_local;
  
  local_18 = optionName;
  optionName_local = (string *)this;
  getString(&local_38,this,optionName);
  __nptr = (char *)std::__cxx11::string::c_str();
  dVar1 = strtod(__nptr,(char **)0x0);
  std::__cxx11::string::~string((string *)&local_38);
  return dVar1;
}

Assistant:

double Options::getDouble(const std::string& optionName) {
	return strtod(getString(optionName).c_str(), (char**)NULL);
}